

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

dtype pybind11::dtype::from_args(object *args)

{
  _func_int_PyObject_ptr_PyObject_ptr_ptr *p_Var1;
  int iVar2;
  npy_api *pnVar3;
  PyObject **ppPVar4;
  undefined8 uVar5;
  handle *in_RSI;
  handle in_RDI;
  error_already_set *in_stack_00000010;
  PyObject *ptr;
  handle local_30 [3];
  PyObject *local_18 [3];
  
  local_18[0] = (PyObject *)0x0;
  pnVar3 = detail::npy_api::get();
  p_Var1 = pnVar3->PyArray_DescrConverter_;
  ppPVar4 = pybind11::handle::ptr(in_RSI);
  iVar2 = (*p_Var1)(*ppPVar4,local_18);
  if ((iVar2 != 0) && (local_18[0] != (PyObject *)0x0)) {
    pybind11::handle::handle(local_30,local_18[0]);
    reinterpret_steal<pybind11::dtype>(in_RDI);
    return (dtype)in_RDI.m_ptr;
  }
  uVar5 = __cxa_allocate_exception(0x28);
  error_already_set::error_already_set(in_stack_00000010);
  __cxa_throw(uVar5,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static dtype from_args(object args) {
        PyObject *ptr = nullptr;
        if (!detail::npy_api::get().PyArray_DescrConverter_(args.ptr(), &ptr) || !ptr)
            throw error_already_set();
        return reinterpret_steal<dtype>(ptr);
    }